

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::AndConstraint::AndConstraint(AndConstraint *this,AndConstraint *other)

{
  UBool UVar1;
  AndConstraint *pAVar2;
  UVector32 *pUVar3;
  AndConstraint *local_80;
  AndConstraint *local_60;
  LocalPointerBase<icu_63::UVector32> local_20;
  LocalPointer<icu_63::UVector32> newRangeList;
  AndConstraint *other_local;
  AndConstraint *this_local;
  
  this->_vptr_AndConstraint = (_func_int **)&PTR__AndConstraint_004f4578;
  this->op = NONE;
  this->opNum = -1;
  this->value = -1;
  this->rangeList = (UVector32 *)0x0;
  this->negated = '\0';
  this->integerOnly = '\0';
  this->digitsType = none;
  this->next = (AndConstraint *)0x0;
  this->fInternalStatus = U_ZERO_ERROR;
  this->fInternalStatus = other->fInternalStatus;
  newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr =
       (LocalPointerBase<icu_63::UVector32>)(LocalPointerBase<icu_63::UVector32>)other;
  UVar1 = ::U_FAILURE(this->fInternalStatus);
  if (UVar1 == '\0') {
    this->op = *(RuleOp *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 8);
    this->opNum = *(int32_t *)
                   ((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0xc);
    this->value = *(int32_t *)
                   ((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x10);
    if (*(long *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x18) != 0) {
      pAVar2 = (AndConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)other);
      local_60 = (AndConstraint *)0x0;
      if (pAVar2 != (AndConstraint *)0x0) {
        UVector32::UVector32((UVector32 *)pAVar2,&this->fInternalStatus);
        local_60 = pAVar2;
      }
      LocalPointer<icu_63::UVector32>::LocalPointer
                ((LocalPointer<icu_63::UVector32> *)&local_20,(UVector32 *)local_60,
                 &this->fInternalStatus);
      UVar1 = ::U_FAILURE(this->fInternalStatus);
      if (UVar1 == '\0') {
        pUVar3 = LocalPointerBase<icu_63::UVector32>::orphan(&local_20);
        this->rangeList = pUVar3;
        local_60 = *(AndConstraint **)
                    ((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x18);
        UVector32::assign(this->rangeList,(UVector32 *)local_60,&this->fInternalStatus);
      }
      LocalPointer<icu_63::UVector32>::~LocalPointer((LocalPointer<icu_63::UVector32> *)&local_20);
      other = local_60;
      if (UVar1 != '\0') {
        return;
      }
    }
    this->integerOnly =
         *(UBool *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x21);
    this->negated =
         *(UBool *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x20);
    this->digitsType =
         *(tokenType *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x24);
    if (*(long *)((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr + 0x28) != 0) {
      pAVar2 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)other);
      local_80 = (AndConstraint *)0x0;
      if (pAVar2 != (AndConstraint *)0x0) {
        AndConstraint(pAVar2,*(AndConstraint **)
                              ((long)newRangeList.super_LocalPointerBase<icu_63::UVector32>.ptr +
                              0x28));
        local_80 = pAVar2;
      }
      this->next = local_80;
      if (this->next == (AndConstraint *)0x0) {
        this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
      }
    }
  }
  return;
}

Assistant:

AndConstraint::AndConstraint(const AndConstraint& other) {
    this->fInternalStatus = other.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid.
    }
    this->op = other.op;
    this->opNum=other.opNum;
    this->value=other.value;
    if (other.rangeList != nullptr) {
        LocalPointer<UVector32> newRangeList(new UVector32(fInternalStatus), fInternalStatus);
        if (U_FAILURE(fInternalStatus)) {
            return;
        }
        this->rangeList = newRangeList.orphan();
        this->rangeList->assign(*other.rangeList, fInternalStatus);
    }
    this->integerOnly=other.integerOnly;
    this->negated=other.negated;
    this->digitsType = other.digitsType;
    if (other.next != nullptr) {
        this->next = new AndConstraint(*other.next);
        if (this->next == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
    }
}